

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptional.h
# Opt level: O2

aiReturn __thiscall ExceptionSwallower<aiReturn>::operator()(ExceptionSwallower<aiReturn> *this)

{
  undefined1 auVar1 [12];
  
  auVar1 = __cxa_rethrow();
  __cxa_begin_catch(auVar1._0_8_);
  __cxa_end_catch();
  return -(uint)(auVar1._8_4_ != 2) | aiReturn_OUTOFMEMORY;
}

Assistant:

aiReturn operator ()() const {
        try {
            throw;
        }
        catch (std::bad_alloc&) {
            return aiReturn_OUTOFMEMORY;
        }
        catch (...) {
            return aiReturn_FAILURE;
        }
    }